

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

void DoReadyWeaponToGeneric(AActor *self,int paramflags)

{
  WORD *pWVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = 0;
  lVar3 = 4;
  do {
    if ((*(uint *)(&UNK_00740f2c + lVar3) & paramflags) != 0) {
      uVar2 = uVar2 | *(uint *)((long)&ButtonChecks[0].ReadyFlag + lVar3);
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 100);
  if ((self != (AActor *)0x0) && (self->player != (player_t *)0x0)) {
    pWVar1 = &self->player->WeaponState;
    *pWVar1 = *pWVar1 | (ushort)uVar2;
  }
  return;
}

Assistant:

void DoReadyWeaponToGeneric(AActor *self, int paramflags)
{
	int flags = 0;

	for (size_t i = 0; i < countof(ButtonChecks); ++i)
	{
		if (paramflags & ButtonChecks[i].ReadyFlag)
		{
			flags |= ButtonChecks[i].StateFlag;
		}
	}
	if (self != NULL && self->player != NULL)
	{
		self->player->WeaponState |= flags;
	}
}